

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> __thiscall
anon_unknown.dwarf_145302::BuildSystemEngineDelegate::lookupRule
          (BuildSystemEngineDelegate *this,KeyType *keyData)

{
  bool bVar1;
  Kind KVar2;
  int iVar3;
  command_set *pcVar4;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>
  *pSVar5;
  undefined4 extraout_var;
  tool_set *this_00;
  pointer pTVar6;
  reference this_01;
  undefined4 extraout_var_00;
  vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_> *this_02
  ;
  pointer ppVar7;
  mapped_type *this_03;
  BuildDescription *pBVar8;
  target_set *ptVar9;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>
  *pSVar10;
  BuildSystemRule *pBVar11;
  KeyType *in_RDX;
  function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> local_b00;
  anon_class_8_1_6ca262cf local_ae0;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_ad8;
  anon_class_8_1_6ca262cf local_ab8;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_ab0;
  CommandSignature local_a90;
  pointer local_a88;
  Target *target;
  StringRef local_a78;
  StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
  local_a68;
  const_iterator it_3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
  local_a40;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_a38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
  local_a18;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_a10;
  CommandSignature local_9f0;
  StringRef local_9e8;
  string local_9d8;
  StringRef local_9b8;
  unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>
  local_9a8;
  type statOwner;
  StringRef local_998;
  string local_988;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
  local_968;
  iterator it_2;
  StatNode *statnode;
  anon_class_8_1_898f5b00 local_938;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_930;
  anon_class_8_1_898f5b00 local_910;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_908;
  CommandSignature local_8e8;
  function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> local_8e0;
  anon_class_8_1_898f5b00 local_8c0;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_8b8;
  anon_class_8_1_898f5b00 local_898;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_890;
  CommandSignature local_870;
  function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> local_868;
  anon_class_8_1_898f5b00 local_848;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_840;
  anon_class_8_1_898f5b00 local_820;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_818;
  CommandSignature local_7f8;
  function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> local_7f0;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_7d0;
  anon_class_8_1_898f5b00 local_7b0;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_7a8;
  CommandSignature local_788;
  function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> local_780;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_760;
  anon_class_8_1_898f5b00 local_740;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_738;
  CommandSignature local_718;
  function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> local_710;
  anon_class_8_1_898f5b00 local_6f0;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_6e8;
  anon_class_1_0_00000001 local_6c1;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_6c0;
  CommandSignature local_6a0;
  StringRef local_698;
  BuildNode *local_688;
  BuildNode *node;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_660;
  anon_class_64_2_e16fcc37 local_640;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_600;
  CommandSignature local_5e0;
  StringRef local_5d8;
  undefined1 local_5c8 [8];
  string filters_1;
  undefined1 local_598 [8];
  string path_3;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_558;
  anon_class_64_2_e16fcc37 local_538;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_4f8;
  CommandSignature local_4d8;
  StringRef local_4d0;
  undefined1 local_4c0 [8];
  string filters;
  undefined1 local_490 [8];
  string path_2;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_450;
  anon_class_64_2_046c2501 local_430;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_3f0;
  CommandSignature local_3d0;
  StringRef local_3c8;
  undefined1 local_3b8 [8];
  string patterns;
  undefined1 local_388 [8];
  string path_1;
  anon_class_32_1_89901123 local_348;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_328;
  anon_class_32_1_89901123 local_308;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_2e8;
  CommandSignature local_2c8;
  StringRef local_2c0;
  undefined1 local_2b0 [8];
  string path;
  anon_class_1_0_00000001 local_269;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_268;
  anon_class_1_0_00000001 local_241;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_240;
  CommandSignature local_220;
  anon_class_8_1_bc00122b local_218;
  function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> local_210;
  anon_class_8_1_bc00122b local_1f0;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_1e8;
  anon_class_8_1_bc00122b local_1c8;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_1c0;
  CommandSignature local_1a0;
  pointer local_198;
  Command *command_1;
  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  result;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>
  *it_1;
  const_iterator __end3;
  const_iterator __begin3;
  tool_set *__range3;
  function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> local_160;
  anon_class_8_1_bc00122b local_140;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_138;
  anon_class_8_1_bc00122b local_118;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_110;
  CommandSignature local_f0;
  pointer local_e8;
  Command *command;
  function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> local_d8;
  anon_class_1_0_00000001 local_b1;
  function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_b0;
  anon_class_1_0_00000001 local_89;
  function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> local_88;
  CommandSignature local_68;
  StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
  local_60;
  StringRef local_58;
  StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
  local_48;
  const_iterator it;
  BuildKey key;
  KeyType *keyData_local;
  BuildSystemEngineDelegate *this_local;
  
  llbuild::buildsystem::BuildKey::fromData((BuildKey *)&it,in_RDX);
  KVar2 = llbuild::buildsystem::BuildKey::getKind((BuildKey *)&it);
  switch(KVar2) {
  case Command:
    pBVar8 = getBuildDescription((BuildSystemEngineDelegate *)keyData);
    pcVar4 = llbuild::buildsystem::BuildDescription::getCommands(pBVar8);
    local_58 = llbuild::buildsystem::BuildKey::getCommandName((BuildKey *)&it);
    local_48.Ptr = (StringMapEntryBase **)
                   llvm::
                   StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                   ::find(pcVar4,local_58);
    pBVar8 = getBuildDescription((BuildSystemEngineDelegate *)keyData);
    pcVar4 = llbuild::buildsystem::BuildDescription::getCommands(pBVar8);
    local_60.Ptr = (StringMapEntryBase **)
                   llvm::
                   StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                   ::end(pcVar4);
    bVar1 = llvm::
            StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
            ::operator==(&local_48,
                         (StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>
                          *)&local_60);
    if (bVar1) {
      pBVar11 = (BuildSystemRule *)operator_new(0x90);
      memset(&local_68,0,8);
      llbuild::basic::CommandSignature::CommandSignature(&local_68);
      std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
      function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__0,void>
                ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_88,&local_89)
      ;
      std::
      function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
      ::
      function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__1,void>
                ((function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                  *)&local_b0,&local_b1);
      std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::function
                (&local_d8,(nullptr_t)0x0);
      BuildSystemRule::BuildSystemRule(pBVar11,in_RDX,&local_68,&local_88,&local_b0,&local_d8);
      std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
      unique_ptr<std::default_delete<llbuild::core::Rule>,void>
                ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
                 (pointer)pBVar11);
      std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::~function
                (&local_d8);
      std::
      function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
      ::~function(&local_b0);
      std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_88);
      command._4_4_ = 1;
    }
    else {
      pSVar5 = llvm::
               iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_&>
               ::operator->((iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_&>
                             *)&local_48);
      local_e8 = std::
                 unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                 ::get(&pSVar5->second);
      pBVar11 = (BuildSystemRule *)operator_new(0x90);
      iVar3 = (*(local_e8->super_JobDescriptor)._vptr_JobDescriptor[6])();
      local_f0.value = CONCAT44(extraout_var,iVar3);
      local_118.command = local_e8;
      std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
      function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__2,void>
                ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_110,
                 &local_118);
      local_140.command = local_e8;
      std::
      function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
      ::
      function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__3,void>
                ((function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                  *)&local_138,&local_140);
      __range3 = (tool_set *)local_e8;
      std::function<void(llbuild::core::BuildEngine&,llbuild::core::Rule::StatusKind)>::
      function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__4,void>
                ((function<void(llbuild::core::BuildEngine&,llbuild::core::Rule::StatusKind)> *)
                 &local_160,(anon_class_8_1_bc00122b *)&__range3);
      BuildSystemRule::BuildSystemRule(pBVar11,in_RDX,&local_f0,&local_110,&local_138,&local_160);
      std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
      unique_ptr<std::default_delete<llbuild::core::Rule>,void>
                ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
                 (pointer)pBVar11);
      std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::~function
                (&local_160);
      std::
      function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
      ::~function(&local_138);
      std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_110);
      command._4_4_ = 1;
    }
    break;
  case CustomTask:
    pBVar8 = getBuildDescription((BuildSystemEngineDelegate *)keyData);
    this_00 = llbuild::buildsystem::BuildDescription::getTools(pBVar8);
    __end3 = llvm::
             StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
             ::begin(this_00);
    it_1 = (StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>
            *)llvm::
              StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
              ::end(this_00);
    while (bVar1 = llvm::
                   iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_&>
                   ::operator!=((iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_&>
                                 *)&__end3,
                                (StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>
                                 *)&it_1), bVar1) {
      result._M_t.
      super___uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::buildsystem::Command_*,_std::default_delete<llbuild::buildsystem::Command>_>
      .super__Head_base<0UL,_llbuild::buildsystem::Command_*,_false>._M_head_impl =
           (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )llvm::
             StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>
             ::operator*(&__end3);
      pTVar6 = std::
               unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
               ::operator->((unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
                             *)((long)result._M_t.
                                      super___uniq_ptr_impl<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_llbuild::buildsystem::Command_*,_std::default_delete<llbuild::buildsystem::Command>_>
                                      .super__Head_base<0UL,_llbuild::buildsystem::Command_*,_false>
                                      ._M_head_impl + 8));
      (*pTVar6->_vptr_Tool[6])(&command_1,pTVar6,&it);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&command_1);
      if (bVar1) {
        std::
        vector<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,std::allocator<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>>
        ::
        emplace_back<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>
                  ((vector<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,std::allocator<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>>>
                    *)(keyData + 4),
                   (unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                    *)&command_1);
        this_01 = std::
                  vector<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_std::allocator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                  ::back((vector<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_std::allocator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
                          *)(keyData + 4));
        local_198 = std::
                    unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                    ::get(this_01);
        pBVar11 = (BuildSystemRule *)operator_new(0x90);
        iVar3 = (*(local_198->super_JobDescriptor)._vptr_JobDescriptor[6])();
        local_1a0.value = CONCAT44(extraout_var_00,iVar3);
        local_1c8.command = local_198;
        std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
        function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__5,void>
                  ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_1c0,
                   &local_1c8);
        local_1f0.command = local_198;
        std::
        function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
        ::
        function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__6,void>
                  ((function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                    *)&local_1e8,&local_1f0);
        local_218.command = local_198;
        std::function<void(llbuild::core::BuildEngine&,llbuild::core::Rule::StatusKind)>::
        function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__7,void>
                  ((function<void(llbuild::core::BuildEngine&,llbuild::core::Rule::StatusKind)> *)
                   &local_210,&local_218);
        BuildSystemRule::BuildSystemRule(pBVar11,in_RDX,&local_1a0,&local_1c0,&local_1e8,&local_210)
        ;
        std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
        unique_ptr<std::default_delete<llbuild::core::Rule>,void>
                  ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
                   (pointer)pBVar11);
        std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
        ~function(&local_210);
        std::
        function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
        ::~function(&local_1e8);
        std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_1c0);
        command._4_4_ = 1;
      }
      else {
        command._4_4_ = 4;
      }
      std::
      unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
      ::~unique_ptr((unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                     *)&command_1);
      if (command._4_4_ != 4) goto LAB_001a1ed8;
      llvm::
      StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
      ::operator++(&__end3.
                    super_StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                  );
    }
    pBVar11 = (BuildSystemRule *)operator_new(0x90);
    memset(&local_220,0,8);
    llbuild::basic::CommandSignature::CommandSignature(&local_220);
    std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
    function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__8,void>
              ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_240,&local_241)
    ;
    std::
    function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
    ::
    function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__9,void>
              ((function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                *)&local_268,&local_269);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path.field_2 + 8),(nullptr_t)0x0);
    BuildSystemRule::BuildSystemRule
              (pBVar11,in_RDX,&local_220,&local_240,&local_268,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path.field_2 + 8));
    std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
    unique_ptr<std::default_delete<llbuild::core::Rule>,void>
              ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
               (pointer)pBVar11);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::~function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path.field_2 + 8));
    std::
    function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::~function(&local_268);
    std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_240);
    command._4_4_ = 1;
    break;
  case DirectoryContents:
    local_2c0 = llbuild::buildsystem::BuildKey::getDirectoryPath((BuildKey *)&it);
    llvm::StringRef::operator_cast_to_string((string *)local_2b0,&local_2c0);
    pBVar11 = (BuildSystemRule *)operator_new(0x90);
    memset(&local_2c8,0,8);
    llbuild::basic::CommandSignature::CommandSignature(&local_2c8);
    std::__cxx11::string::string((string *)&local_308,(string *)local_2b0);
    std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
    function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__10,void>
              ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_2e8,&local_308)
    ;
    std::__cxx11::string::string((string *)&local_348,(string *)local_2b0);
    std::
    function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
    ::
    function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__11,void>
              ((function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                *)&local_328,&local_348);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path_1.field_2 + 8),(nullptr_t)0x0);
    BuildSystemRule::BuildSystemRule
              (pBVar11,in_RDX,&local_2c8,&local_2e8,&local_328,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path_1.field_2 + 8));
    std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
    unique_ptr<std::default_delete<llbuild::core::Rule>,void>
              ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
               (pointer)pBVar11);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::~function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path_1.field_2 + 8));
    std::
    function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::~function(&local_328);
    (anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::
    $_11::~__11((__11 *)&local_348);
    std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_2e8);
    (anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::
    $_10::~__10((__10 *)&local_308);
    command._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_2b0);
    break;
  case FilteredDirectoryContents:
    join_0x00000010_0x00000000_ =
         llbuild::buildsystem::BuildKey::getFilteredDirectoryPath((BuildKey *)&it);
    llvm::StringRef::operator_cast_to_string
              ((string *)local_388,(StringRef *)((long)&patterns.field_2 + 8));
    local_3c8 = llbuild::buildsystem::BuildKey::getContentExclusionPatterns((BuildKey *)&it);
    llvm::StringRef::operator_cast_to_string((string *)local_3b8,&local_3c8);
    pBVar11 = (BuildSystemRule *)operator_new(0x90);
    memset(&local_3d0,0,8);
    llbuild::basic::CommandSignature::CommandSignature(&local_3d0);
    std::__cxx11::string::string((string *)&local_430,(string *)local_388);
    std::__cxx11::string::string((string *)&local_430.patterns,(string *)local_3b8);
    std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
    function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__12,void>
              ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_3f0,&local_430)
    ;
    std::
    function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::function(&local_450,(nullptr_t)0x0);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path_2.field_2 + 8),(nullptr_t)0x0);
    BuildSystemRule::BuildSystemRule
              (pBVar11,in_RDX,&local_3d0,&local_3f0,&local_450,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path_2.field_2 + 8));
    std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
    unique_ptr<std::default_delete<llbuild::core::Rule>,void>
              ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
               (pointer)pBVar11);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::~function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path_2.field_2 + 8));
    std::
    function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::~function(&local_450);
    std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_3f0);
    (anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::
    $_12::~__12((__12 *)&local_430);
    command._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_3b8);
    std::__cxx11::string::~string((string *)local_388);
    break;
  case DirectoryTreeSignature:
    join_0x00000010_0x00000000_ =
         llbuild::buildsystem::BuildKey::getDirectoryTreeSignaturePath((BuildKey *)&it);
    llvm::StringRef::operator_cast_to_string
              ((string *)local_490,(StringRef *)((long)&filters.field_2 + 8));
    local_4d0 = llbuild::buildsystem::BuildKey::getContentExclusionPatterns((BuildKey *)&it);
    llvm::StringRef::operator_cast_to_string((string *)local_4c0,&local_4d0);
    pBVar11 = (BuildSystemRule *)operator_new(0x90);
    memset(&local_4d8,0,8);
    llbuild::basic::CommandSignature::CommandSignature(&local_4d8);
    std::__cxx11::string::string((string *)&local_538,(string *)local_490);
    std::__cxx11::string::string((string *)&local_538.filters,(string *)local_4c0);
    std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
    function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__13,void>
              ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_4f8,&local_538)
    ;
    std::
    function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::function(&local_558,(nullptr_t)0x0);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path_3.field_2 + 8),(nullptr_t)0x0);
    BuildSystemRule::BuildSystemRule
              (pBVar11,in_RDX,&local_4d8,&local_4f8,&local_558,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path_3.field_2 + 8));
    std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
    unique_ptr<std::default_delete<llbuild::core::Rule>,void>
              ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
               (pointer)pBVar11);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::~function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               ((long)&path_3.field_2 + 8));
    std::
    function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::~function(&local_558);
    std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_4f8);
    (anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::
    $_13::~__13((__13 *)&local_538);
    command._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_4c0);
    std::__cxx11::string::~string((string *)local_490);
    break;
  case DirectoryTreeStructureSignature:
    join_0x00000010_0x00000000_ =
         llbuild::buildsystem::BuildKey::getFilteredDirectoryPath((BuildKey *)&it);
    llvm::StringRef::operator_cast_to_string
              ((string *)local_598,(StringRef *)((long)&filters_1.field_2 + 8));
    local_5d8 = llbuild::buildsystem::BuildKey::getContentExclusionPatterns((BuildKey *)&it);
    llvm::StringRef::operator_cast_to_string((string *)local_5c8,&local_5d8);
    pBVar11 = (BuildSystemRule *)operator_new(0x90);
    memset(&local_5e0,0,8);
    llbuild::basic::CommandSignature::CommandSignature(&local_5e0);
    std::__cxx11::string::string((string *)&local_640,(string *)local_598);
    std::__cxx11::string::string((string *)&local_640.filters,(string *)local_5c8);
    std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
    function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__14,void>
              ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_600,&local_640)
    ;
    std::
    function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::function(&local_660,(nullptr_t)0x0);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &node,(nullptr_t)0x0);
    BuildSystemRule::BuildSystemRule
              (pBVar11,in_RDX,&local_5e0,&local_600,&local_660,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &node);
    std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
    unique_ptr<std::default_delete<llbuild::core::Rule>,void>
              ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
               (pointer)pBVar11);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::~function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &node);
    std::
    function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::~function(&local_660);
    std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_600);
    (anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::
    $_14::~__14((__14 *)&local_640);
    command._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_5c8);
    std::__cxx11::string::~string((string *)local_598);
    break;
  case Node:
    local_698 = llbuild::buildsystem::BuildKey::getNodeName((BuildKey *)&it);
    local_688 = lookupNode((BuildSystemEngineDelegate *)keyData,local_698);
    this_02 = llbuild::buildsystem::Node::getProducers(&local_688->super_Node);
    bVar1 = std::
            vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            ::empty(this_02);
    if (bVar1) {
      bVar1 = llbuild::buildsystem::BuildNode::isVirtual(local_688);
      if (bVar1) {
        pBVar11 = (BuildSystemRule *)operator_new(0x90);
        local_6a0 = llbuild::buildsystem::BuildNode::getSignature(local_688);
        std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
        function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__15,void>
                  ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_6c0,
                   &local_6c1);
        local_6f0.node = local_688;
        std::
        function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
        ::
        function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__16,void>
                  ((function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                    *)&local_6e8,&local_6f0);
        std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
        function(&local_710,(nullptr_t)0x0);
        BuildSystemRule::BuildSystemRule(pBVar11,in_RDX,&local_6a0,&local_6c0,&local_6e8,&local_710)
        ;
        std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
        unique_ptr<std::default_delete<llbuild::core::Rule>,void>
                  ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
                   (pointer)pBVar11);
        std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
        ~function(&local_710);
        std::
        function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
        ::~function(&local_6e8);
        std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_6c0);
        command._4_4_ = 1;
      }
      else {
        bVar1 = llbuild::buildsystem::BuildNode::isDirectory(local_688);
        if (bVar1) {
          pBVar11 = (BuildSystemRule *)operator_new(0x90);
          local_718 = llbuild::buildsystem::BuildNode::getSignature(local_688);
          local_740.node = local_688;
          std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
          function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__17,void>
                    ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_738,
                     &local_740);
          std::
          function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
          ::function(&local_760,(nullptr_t)0x0);
          std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
          function(&local_780,(nullptr_t)0x0);
          BuildSystemRule::BuildSystemRule
                    (pBVar11,in_RDX,&local_718,&local_738,&local_760,&local_780);
          std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
          unique_ptr<std::default_delete<llbuild::core::Rule>,void>
                    ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)
                     this,(pointer)pBVar11);
          std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
          ~function(&local_780);
          std::
          function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
          ::~function(&local_760);
          std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_738);
          command._4_4_ = 1;
        }
        else {
          bVar1 = llbuild::buildsystem::BuildNode::isDirectoryStructure(local_688);
          if (bVar1) {
            pBVar11 = (BuildSystemRule *)operator_new(0x90);
            local_788 = llbuild::buildsystem::BuildNode::getSignature(local_688);
            local_7b0.node = local_688;
            std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
            function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__18,void>
                      ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_7a8,
                       &local_7b0);
            std::
            function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
            ::function(&local_7d0,(nullptr_t)0x0);
            std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
            function(&local_7f0,(nullptr_t)0x0);
            BuildSystemRule::BuildSystemRule
                      (pBVar11,in_RDX,&local_788,&local_7a8,&local_7d0,&local_7f0);
            std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
            unique_ptr<std::default_delete<llbuild::core::Rule>,void>
                      ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)
                       this,(pointer)pBVar11);
            std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
            ~function(&local_7f0);
            std::
            function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
            ::~function(&local_7d0);
            std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function
                      (&local_7a8);
            command._4_4_ = 1;
          }
          else {
            pBVar11 = (BuildSystemRule *)operator_new(0x90);
            local_7f8 = llbuild::buildsystem::BuildNode::getSignature(local_688);
            local_820.node = local_688;
            std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
            function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__19,void>
                      ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_818,
                       &local_820);
            local_848.node = local_688;
            std::
            function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
            ::
            function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__20,void>
                      ((function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                        *)&local_840,&local_848);
            std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
            function(&local_868,(nullptr_t)0x0);
            BuildSystemRule::BuildSystemRule
                      (pBVar11,in_RDX,&local_7f8,&local_818,&local_840,&local_868);
            std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
            unique_ptr<std::default_delete<llbuild::core::Rule>,void>
                      ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)
                       this,(pointer)pBVar11);
            std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
            ~function(&local_868);
            std::
            function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
            ::~function(&local_840);
            std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function
                      (&local_818);
            command._4_4_ = 1;
          }
        }
      }
    }
    else {
      bVar1 = llbuild::buildsystem::BuildNode::isDirectory(local_688);
      if (bVar1) {
        pBVar11 = (BuildSystemRule *)operator_new(0x90);
        local_870 = llbuild::buildsystem::BuildNode::getSignature(local_688);
        local_898.node = local_688;
        std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
        function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__21,void>
                  ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_890,
                   &local_898);
        local_8c0.node = local_688;
        std::
        function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
        ::
        function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__22,void>
                  ((function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                    *)&local_8b8,&local_8c0);
        std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
        function(&local_8e0,(nullptr_t)0x0);
        BuildSystemRule::BuildSystemRule(pBVar11,in_RDX,&local_870,&local_890,&local_8b8,&local_8e0)
        ;
        std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
        unique_ptr<std::default_delete<llbuild::core::Rule>,void>
                  ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
                   (pointer)pBVar11);
        std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
        ~function(&local_8e0);
        std::
        function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
        ::~function(&local_8b8);
        std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_890);
        command._4_4_ = 1;
      }
      else {
        pBVar11 = (BuildSystemRule *)operator_new(0x90);
        local_8e8 = llbuild::buildsystem::BuildNode::getSignature(local_688);
        local_910.node = local_688;
        std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
        function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__23,void>
                  ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_908,
                   &local_910);
        local_938.node = local_688;
        std::
        function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
        ::
        function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__24,void>
                  ((function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                    *)&local_930,&local_938);
        std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
        function((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
                 &statnode,(nullptr_t)0x0);
        BuildSystemRule::BuildSystemRule
                  (pBVar11,in_RDX,&local_8e8,&local_908,&local_930,
                   (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *
                   )&statnode);
        std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
        unique_ptr<std::default_delete<llbuild::core::Rule>,void>
                  ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
                   (pointer)pBVar11);
        std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::
        ~function((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
                  &statnode);
        std::
        function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
        ::~function(&local_930);
        std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_908);
        command._4_4_ = 1;
      }
    }
    break;
  case Stat:
    local_998 = llbuild::buildsystem::BuildKey::getStatName((BuildKey *)&it);
    llvm::StringRef::operator_cast_to_string(&local_988,&local_998);
    local_968._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>_>
                 *)&keyData[2].key._M_string_length,&local_988);
    std::__cxx11::string::~string((string *)&local_988);
    statOwner._M_t.
    super___uniq_ptr_impl<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>
    ._M_t.
    super__Tuple_impl<0UL,_llbuild::buildsystem::StatNode_*,_std::default_delete<llbuild::buildsystem::StatNode>_>
    .super__Head_base<0UL,_llbuild::buildsystem::StatNode_*,_false>._M_head_impl =
         (__uniq_ptr_data<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>,_true,_true>
          )std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>_>
                  *)&keyData[2].key._M_string_length);
    bVar1 = std::__detail::operator!=
                      (&local_968,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
                        *)&statOwner);
    if (bVar1) {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_false,_true>
                             *)&local_968);
      it_2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
                 )std::
                  unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>
                  ::get(&ppVar7->second);
    }
    else {
      local_9b8 = llbuild::buildsystem::BuildKey::getStatName((BuildKey *)&it);
      llvm::make_unique<llbuild::buildsystem::StatNode,llvm::StringRef>
                ((llvm *)&local_9a8,&local_9b8);
      it_2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
                 )std::
                  unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>
                  ::get(&local_9a8);
      local_9e8 = llbuild::buildsystem::BuildKey::getStatName((BuildKey *)&it);
      llvm::StringRef::operator_cast_to_string(&local_9d8,&local_9e8);
      this_03 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>_>_>
                              *)&keyData[2].key._M_string_length,&local_9d8);
      std::
      unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>
      ::operator=(this_03,&local_9a8);
      std::__cxx11::string::~string((string *)&local_9d8);
      std::
      unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>
      ::~unique_ptr(&local_9a8);
    }
    pBVar11 = (BuildSystemRule *)operator_new(0x90);
    memset(&local_9f0,0,8);
    llbuild::basic::CommandSignature::CommandSignature(&local_9f0);
    local_a18 = it_2.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
                ._M_cur;
    std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
    function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__25,void>
              ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_a10,
               (anon_class_8_1_36828fd4 *)&local_a18);
    local_a40 = it_2.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>_>_>,_true>
                ._M_cur;
    std::
    function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
    ::
    function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__26,void>
              ((function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                *)&local_a38,(anon_class_8_1_36828fd4 *)&local_a40);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &it_3,(nullptr_t)0x0);
    BuildSystemRule::BuildSystemRule
              (pBVar11,in_RDX,&local_9f0,&local_a10,&local_a38,
               (function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &it_3);
    std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
    unique_ptr<std::default_delete<llbuild::core::Rule>,void>
              ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
               (pointer)pBVar11);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::~function
              ((function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)> *)
               &it_3);
    std::
    function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::~function(&local_a38);
    std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_a10);
    command._4_4_ = 1;
    break;
  case Target:
    pBVar8 = getBuildDescription((BuildSystemEngineDelegate *)keyData);
    ptVar9 = llbuild::buildsystem::BuildDescription::getTargets(pBVar8);
    local_a78 = llbuild::buildsystem::BuildKey::getTargetName((BuildKey *)&it);
    local_a68.Ptr =
         (StringMapEntryBase **)
         llvm::
         StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
         ::find(ptVar9,local_a78);
    pBVar8 = getBuildDescription((BuildSystemEngineDelegate *)keyData);
    ptVar9 = llbuild::buildsystem::BuildDescription::getTargets(pBVar8);
    target = (Target *)
             llvm::
             StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
             ::end(ptVar9);
    bVar1 = llvm::
            StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
            ::operator==(&local_a68,
                         (StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>
                          *)&target);
    if (bVar1) {
      __assert_fail("0 && \"FIXME: invalid target\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x7df,
                    "virtual std::unique_ptr<Rule> (anonymous namespace)::BuildSystemEngineDelegate::lookupRule(const KeyType &)"
                   );
    }
    pSVar10 = llvm::
              iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_&>
              ::operator->((iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_&>
                            *)&local_a68);
    local_a88 = std::
                unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>
                ::get(&pSVar10->second);
    pBVar11 = (BuildSystemRule *)operator_new(0x90);
    memset(&local_a90,0,8);
    llbuild::basic::CommandSignature::CommandSignature(&local_a90);
    local_ab8.target = local_a88;
    std::function<llbuild::core::Task*(llbuild::core::BuildEngine&)>::
    function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__27,void>
              ((function<llbuild::core::Task*(llbuild::core::BuildEngine&)> *)&local_ab0,&local_ab8)
    ;
    local_ae0.target = local_a88;
    std::
    function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
    ::
    function<(anonymous_namespace)::BuildSystemEngineDelegate::lookupRule(llbuild::core::KeyType_const&)::__28,void>
              ((function<bool(llbuild::core::BuildEngine&,llbuild::core::Rule_const&,std::vector<unsigned_char,std::allocator<unsigned_char>>const&)>
                *)&local_ad8,&local_ae0);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::function
              (&local_b00,(nullptr_t)0x0);
    BuildSystemRule::BuildSystemRule(pBVar11,in_RDX,&local_a90,&local_ab0,&local_ad8,&local_b00);
    std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
    unique_ptr<std::default_delete<llbuild::core::Rule>,void>
              ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)this,
               (pointer)pBVar11);
    std::function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>::~function
              (&local_b00);
    std::
    function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::~function(&local_ad8);
    std::function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)>::~function(&local_ab0);
    command._4_4_ = 1;
    break;
  case Unknown:
  default:
    __assert_fail("0 && \"invalid key type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                  ,0x7f4,
                  "virtual std::unique_ptr<Rule> (anonymous namespace)::BuildSystemEngineDelegate::lookupRule(const KeyType &)"
                 );
  }
LAB_001a1ed8:
  llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)&it);
  return (__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
         )(__uniq_ptr_data<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<Rule> BuildSystemEngineDelegate::lookupRule(const KeyType& keyData) {
  // Decode the key.
  auto key = BuildKey::fromData(keyData);

  switch (key.getKind()) {
  case BuildKey::Kind::Unknown:
    break;
    
  case BuildKey::Kind::Command: {
    // Find the comand.
    auto it = getBuildDescription().getCommands().find(key.getCommandName());
    if (it == getBuildDescription().getCommands().end()) {
      // If there is no such command, produce an error task.
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        /*signature=*/{},
        /*Action=*/ [](BuildEngine& engine) -> Task* {
          return new MissingCommandTask();
        },
        /*IsValid=*/ [](BuildEngine&, const Rule&, const ValueType&) -> bool {
          // The cached result for a missing command is never valid.
          return false;
        }
      ));
    }

    // Create the rule for the command.
    Command* command = it->second.get();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      command->getSignature(),
      /*Action=*/ [command](BuildEngine& engine) -> Task* {
        return new CommandTask(*command);
      },
      /*IsValid=*/ [command](BuildEngine& engine, const Rule& rule,
                             const ValueType& value) -> bool {
        return CommandTask::isResultValid(
            engine, *command, BuildValue::fromData(value));
      },
      /*UpdateStatus=*/ [command](BuildEngine& engine,
                                  core::Rule::StatusKind status) {
        return ::getBuildSystem(engine).getDelegate().commandStatusChanged(
            command, convertStatusKind(status));
      }
    ));
  }

  case BuildKey::Kind::CustomTask: {
    // Search for a tool which knows how to create the given custom task.
    //
    // FIXME: We should most likely have some kind of registration process so we
    // can do an efficient query here, but exactly how this should look isn't
    // clear yet.
    for (const auto& it: getBuildDescription().getTools()) {
      auto result = it.second->createCustomCommand(key);
      if (!result) continue;

      // Save the custom command.
      customTasks.emplace_back(std::move(result));
      Command *command = customTasks.back().get();
      
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        command->getSignature(),
        /*Action=*/ [command](BuildEngine& engine) -> Task* {
          return new CommandTask(*command);
        },
        /*IsValid=*/ [command](BuildEngine& engine, const Rule& rule,
                               const ValueType& value) -> bool {
          return CommandTask::isResultValid(
              engine, *command, BuildValue::fromData(value));
        },
        /*UpdateStatus=*/ [command](BuildEngine& engine,
                                    core::Rule::StatusKind status) {
          return ::getBuildSystem(engine).getDelegate().commandStatusChanged(
              command, convertStatusKind(status));
        }
      ));
    }
    
    // We were unable to create an appropriate custom command, produce an error
    // task.
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [](BuildEngine& engine) -> Task* {
        return new MissingCommandTask();
      },
      /*IsValid=*/ [](BuildEngine&, const Rule&, const ValueType&) -> bool {
        // The cached result for a missing command is never valid.
        return false;
      }
    ));
  }

  case BuildKey::Kind::DirectoryContents: {
    std::string path = key.getDirectoryPath();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path](BuildEngine& engine) -> Task* {
        return new DirectoryContentsTask(path);
      },
      /*IsValid=*/ [path](BuildEngine& engine, const Rule& rule,
          const ValueType& value) mutable -> bool {
        return DirectoryContentsTask::isResultValid(
            engine, path, BuildValue::fromData(value));
      }
    ));
  }

  case BuildKey::Kind::FilteredDirectoryContents: {
    std::string path = key.getFilteredDirectoryPath();
    std::string patterns = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, patterns](BuildEngine& engine) -> Task* {
        BinaryDecoder decoder(patterns);
        return new FilteredDirectoryContentsTask(path, StringList(decoder));
      },
      /*IsValid=*/ nullptr
    ));
  }

  case BuildKey::Kind::DirectoryTreeSignature: {
    std::string path = key.getDirectoryTreeSignaturePath();
    std::string filters = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, filters](
          BuildEngine& engine) mutable -> Task* {
        BinaryDecoder decoder(filters);
        return new DirectoryTreeSignatureTask(path, StringList(decoder));
      },
        // Directory signatures don't require any validation outside of their
        // concrete dependencies.
      /*IsValid=*/ nullptr
    ));
  }

  case BuildKey::Kind::DirectoryTreeStructureSignature: {
    std::string path = key.getFilteredDirectoryPath();
    std::string filters = key.getContentExclusionPatterns();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [path, filters](
          BuildEngine& engine) mutable -> Task* {
        BinaryDecoder decoder(filters);
        return new DirectoryTreeStructureSignatureTask(path, StringList(decoder));
      },
        // Directory signatures don't require any validation outside of their
        // concrete dependencies.
      /*IsValid=*/ nullptr
    ));
  }
    
  case BuildKey::Kind::Node: {
    // Find the node.
    BuildNode* node = lookupNode(key.getNodeName());

    // Create the rule used to construct this node.
    //
    // We could bypass this level and directly return the rule to run the
    // command, which would reduce the number of tasks in the system. For now we
    // do the uniform thing, but do differentiate between input and command
    // nodes.

    // Create an input node if there are no producers.
    if (node->getProducers().empty()) {
      if (node->isVirtual()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [](BuildEngine& engine) -> Task* {
            return new VirtualInputNodeTask();
          },
          /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                                const ValueType& value) -> bool {
            return VirtualInputNodeTask::isResultValid(
                engine, *node, BuildValue::fromData(value));
          }
        ));
      }

      // DirectoryInputNodeTask
      if (node->isDirectory()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [node](BuildEngine& engine) -> Task* {
            return new DirectoryInputNodeTask(*node);
          },
            // Directory nodes don't require any validation outside of their
            // concrete dependencies.
          /*IsValid=*/ nullptr
        ));
      }

      if (node->isDirectoryStructure()) {
        return std::unique_ptr<Rule>(new BuildSystemRule(
          keyData,
          node->getSignature(),
          /*Action=*/ [node](BuildEngine& engine) -> Task* {
            return new DirectoryStructureInputNodeTask(*node);
          },
            // Directory nodes don't require any validation outside of their
            // concrete dependencies.
          /*IsValid=*/ nullptr
        ));
      }

      // FileInputNodeTask
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        node->getSignature(),
        /*Action=*/ [node](BuildEngine& engine) -> Task* {
          return new FileInputNodeTask(*node);
        },
        /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
          return FileInputNodeTask::isResultValid(
              engine, *node, BuildValue::fromData(value));
        }
      ));
    }

    // Otherwise, create a task for a produced node.
    // ProducedDirectoryNodeTask
    if (node->isDirectory()) {
      return std::unique_ptr<Rule>(new BuildSystemRule(
        keyData,
        node->getSignature(),
        /*Action=*/ [node](BuildEngine& engine) -> Task* {
          return new ProducedDirectoryNodeTask(*node);
        },
        /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
          return ProducedDirectoryNodeTask::isResultValid(
              engine, *node, BuildValue::fromData(value));
        }
      ));
    }

    // ProducedNodeTask
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      node->getSignature(),
      /*Action=*/ [node](BuildEngine& engine) -> Task* {
        return new ProducedNodeTask(*node);
      },
      /*IsValid=*/ [node](BuildEngine& engine, const Rule& rule,
                          const ValueType& value) -> bool {
        return ProducedNodeTask::isResultValid(
            engine, *node, BuildValue::fromData(value));
      }
    ));
  }

  case BuildKey::Kind::Stat: {
    StatNode* statnode;
    auto it = dynamicStatNodes.find(key.getStatName());
    if (it != dynamicStatNodes.end()) {
      statnode = it->second.get();
    } else {
      // Create nodes on the fly for any unknown ones.
      auto statOwner = llvm::make_unique<StatNode>(key.getStatName());
      statnode = statOwner.get();
      dynamicStatNodes[key.getStatName()] = std::move(statOwner);
    }

    // Create the rule to construct this target.
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [statnode](BuildEngine& engine) -> Task* {
        return new StatTask(*statnode);
      },
      /*IsValid=*/ [statnode](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
        return StatTask::isResultValid(
            engine, *statnode, BuildValue::fromData(value));
      }
    ));
  }
  case BuildKey::Kind::Target: {
    // Find the target.
    auto it = getBuildDescription().getTargets().find(key.getTargetName());
    if (it == getBuildDescription().getTargets().end()) {
      // FIXME: Invalid target name, produce an error.
      assert(0 && "FIXME: invalid target");
      abort();
    }

    // Create the rule to construct this target.
    Target* target = it->second.get();
    return std::unique_ptr<Rule>(new BuildSystemRule(
      keyData,
      /*signature=*/{},
      /*Action=*/ [target](BuildEngine& engine) -> Task* {
        return new TargetTask(*target);
      },
      /*IsValid=*/ [target](BuildEngine& engine, const Rule& rule,
                            const ValueType& value) -> bool {
        return TargetTask::isResultValid(
            engine, *target, BuildValue::fromData(value));
      }
    ));
  }
  }

  assert(0 && "invalid key type");
  abort();
}